

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O0

type dukglue_pcall<void,DukValue>(duk_context *ctx,DukValue *obj)

{
  duk_int_t return_code;
  DukErrorException *this;
  DukValue *pDStack_30;
  duk_int_t rc;
  SafeCallData<void,_DukValue> data;
  DukValue *obj_local;
  duk_context *ctx_local;
  
  data._8_8_ = 0;
  pDStack_30 = obj;
  data.out = obj;
  return_code = duk_safe_call(ctx,dukglue::detail::call_safe<void,DukValue>,&stack0xffffffffffffffd0
                              ,0,1);
  if (return_code != 0) {
    this = (DukErrorException *)__cxa_allocate_exception(0x28);
    DukErrorException::DukErrorException(this,ctx,return_code,true);
    __cxa_throw(this,&DukErrorException::typeinfo,DukErrorException::~DukErrorException);
  }
  duk_pop(ctx);
  return;
}

Assistant:

typename std::enable_if<std::is_void<RetT>::value, RetT>::type dukglue_pcall(duk_context* ctx, const ObjT& obj, ArgTs... args)
{
	dukglue::detail::SafeCallData<RetT, ObjT, ArgTs...> data{
		&obj, std::tuple<ArgTs...>(args...), nullptr
	};

	duk_int_t rc = duk_safe_call(ctx, &dukglue::detail::call_safe<RetT, ObjT, ArgTs...>, (void*) &data, 0, 1);
	if (rc != 0)
		throw DukErrorException(ctx, rc);
	duk_pop(ctx);  // remove result from stack
}